

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

boolean get_interesting_appn(j_decompress_ptr cinfo)

{
  byte bVar1;
  int iVar2;
  jpeg_source_mgr *pjVar3;
  boolean bVar4;
  jpeg_error_mgr *pjVar5;
  ulong uVar6;
  long lVar7;
  j_decompress_ptr pjVar8;
  size_t sVar9;
  byte *pbVar10;
  uint uVar11;
  ulong uVar12;
  JOCTET b [14];
  byte local_56 [4];
  char local_52;
  undefined2 local_51;
  UINT8 local_4f;
  byte bStack_4e;
  byte bStack_4d;
  byte bStack_4c;
  byte bStack_4b;
  byte local_4a;
  byte local_49;
  long local_48;
  j_decompress_ptr local_40;
  ulong local_38;
  
  pjVar3 = cinfo->src;
  sVar9 = pjVar3->bytes_in_buffer;
  local_40 = cinfo;
  if (sVar9 == 0) {
    bVar4 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar4 == 0) {
      return 0;
    }
    sVar9 = pjVar3->bytes_in_buffer;
  }
  bVar1 = *pjVar3->next_input_byte;
  sVar9 = sVar9 - 1;
  if (sVar9 == 0) {
    bVar4 = (*pjVar3->fill_input_buffer)(local_40);
    if (bVar4 == 0) {
      return 0;
    }
    pbVar10 = pjVar3->next_input_byte;
    sVar9 = pjVar3->bytes_in_buffer;
  }
  else {
    pbVar10 = pjVar3->next_input_byte + 1;
  }
  uVar12 = (ulong)bVar1 * 0x100;
  local_38 = uVar12 | *pbVar10;
  local_48 = uVar12 + *pbVar10 + -2;
  uVar11 = 0;
  if (2 < local_38) {
    uVar11 = (uint)local_48;
  }
  uVar12 = 0xe;
  if (local_38 < 0x10) {
    uVar12 = (ulong)uVar11;
  }
  pbVar10 = pbVar10 + 1;
  sVar9 = sVar9 - 1;
  uVar11 = (uint)uVar12;
  pjVar8 = local_40;
  if (uVar11 != 0) {
    uVar6 = 0;
    do {
      if (sVar9 == 0) {
        bVar4 = (*pjVar3->fill_input_buffer)(pjVar8);
        if (bVar4 == 0) {
          return 0;
        }
        pbVar10 = pjVar3->next_input_byte;
        sVar9 = pjVar3->bytes_in_buffer;
        pjVar8 = local_40;
      }
      local_56[uVar6] = *pbVar10;
      uVar6 = uVar6 + 1;
      pbVar10 = pbVar10 + 1;
      sVar9 = sVar9 - 1;
    } while (uVar12 != uVar6);
  }
  lVar7 = local_48 - uVar12;
  iVar2 = pjVar8->unread_marker;
  if (iVar2 == 0xee) {
    if (((((0xb < uVar11) && (local_56[0] == 0x41)) && (local_56[1] == 'd')) &&
        ((local_56[2] == 'o' && (local_56[3] == 'b')))) && (local_52 == 'e')) {
      pjVar5 = pjVar8->err;
      *(uint *)&pjVar5->msg_parm = (uint)(ushort)(local_51 << 8 | local_51 >> 8);
      *(uint *)((long)&pjVar5->msg_parm + 4) =
           (uint)(ushort)(CONCAT11(bStack_4e,local_4f) << 8 | (ushort)bStack_4e);
      *(uint *)((long)&pjVar5->msg_parm + 8) =
           (uint)(ushort)(CONCAT11(bStack_4c,bStack_4d) << 8 | (ushort)bStack_4c);
      *(uint *)((long)&pjVar5->msg_parm + 0xc) = (uint)bStack_4b;
      pjVar5->msg_code = 0x4e;
      (*pjVar5->emit_message)((j_common_ptr)pjVar8,1);
      pjVar8->saw_Adobe_marker = 1;
      pjVar8->Adobe_transform = bStack_4b;
      goto LAB_00106cfa;
    }
    pjVar5 = pjVar8->err;
    pjVar5->msg_code = 0x50;
    (pjVar5->msg_parm).i[0] = uVar11 + (int)lVar7;
  }
  else {
    if (iVar2 != 0xe0) {
      pjVar5 = pjVar8->err;
      pjVar5->msg_code = 0x46;
      (pjVar5->msg_parm).i[0] = iVar2;
      (*pjVar8->err->error_exit)((j_common_ptr)pjVar8);
      goto LAB_00106cfa;
    }
    if (((uVar11 < 0xe) || (local_56[0] != 0x4a)) ||
       ((local_56[1] != 'F' ||
        (((local_56[2] != 'I' || (local_56[3] != 'F')) || (local_52 != '\0')))))) {
      if (((uVar11 < 6) || (local_56[0] != 0x4a)) ||
         ((local_56[1] != 'F' ||
          (((local_56[2] != 'X' || (local_56[3] != 'X')) || (local_52 != '\0')))))) {
        pjVar5 = pjVar8->err;
        pjVar5->msg_code = 0x4f;
      }
      else {
        pjVar5 = pjVar8->err;
        if ((byte)local_51 == 0x13) {
          pjVar5->msg_code = 0x70;
        }
        else if ((byte)local_51 == 0x11) {
          pjVar5->msg_code = 0x6f;
        }
        else {
          if ((byte)local_51 != 0x10) {
            pjVar5->msg_code = 0x5b;
            (pjVar5->msg_parm).i[0] = (uint)(byte)local_51;
            (pjVar8->err->msg_parm).i[1] = (int)local_48;
            goto LAB_00106cef;
          }
          pjVar5->msg_code = 0x6e;
        }
      }
      (pjVar5->msg_parm).i[0] = (int)local_48;
    }
    else {
      pjVar8->saw_JFIF_marker = 1;
      pjVar8->JFIF_major_version = (byte)local_51;
      pjVar8->JFIF_minor_version = local_51._1_1_;
      pjVar8->density_unit = local_4f;
      pjVar8->X_density = CONCAT11(bStack_4d,bStack_4e) << 8 | (ushort)bStack_4d;
      pjVar8->Y_density = CONCAT11(bStack_4b,bStack_4c) << 8 | (ushort)bStack_4b;
      local_48 = lVar7;
      if ((byte)local_51 != 1) {
        pjVar5 = pjVar8->err;
        pjVar5->msg_code = 0x7a;
        (pjVar5->msg_parm).i[0] = (uint)(byte)local_51;
        *(uint *)((long)&pjVar8->err->msg_parm + 4) = (uint)pjVar8->JFIF_minor_version;
        (*pjVar8->err->emit_message)((j_common_ptr)local_40,-1);
        pjVar8 = local_40;
      }
      pjVar5 = pjVar8->err;
      *(uint *)&pjVar5->msg_parm = (uint)pjVar8->JFIF_major_version;
      *(uint *)((long)&pjVar5->msg_parm + 4) = (uint)pjVar8->JFIF_minor_version;
      *(uint *)((long)&pjVar5->msg_parm + 8) = (uint)pjVar8->X_density;
      *(uint *)((long)&pjVar5->msg_parm + 0xc) = (uint)pjVar8->Y_density;
      *(uint *)((long)&pjVar5->msg_parm + 0x10) = (uint)pjVar8->density_unit;
      pjVar5->msg_code = 0x59;
      (*pjVar5->emit_message)((j_common_ptr)pjVar8,1);
      if (local_49 != 0 || local_4a != 0) {
        pjVar5 = pjVar8->err;
        pjVar5->msg_code = 0x5c;
        *(uint *)&pjVar5->msg_parm = (uint)local_4a;
        *(uint *)((long)&pjVar8->err->msg_parm + 4) = (uint)local_49;
        (*pjVar8->err->emit_message)((j_common_ptr)pjVar8,1);
      }
      lVar7 = local_48;
      if (local_38 - 0x10 == (ulong)local_49 * (ulong)local_4a * 3) goto LAB_00106cfa;
      pjVar5 = local_40->err;
      pjVar5->msg_code = 0x5a;
      (pjVar5->msg_parm).i[0] = (int)(local_38 - 0x10);
      pjVar8 = local_40;
    }
  }
LAB_00106cef:
  (*pjVar8->err->emit_message)((j_common_ptr)pjVar8,1);
LAB_00106cfa:
  pjVar3->next_input_byte = pbVar10;
  pjVar3->bytes_in_buffer = sVar9;
  if (0 < lVar7) {
    (*local_40->src->skip_input_data)(local_40,lVar7);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
get_interesting_appn (j_decompress_ptr cinfo)
/* Process an APP0 or APP14 marker without saving it */
{
  INT32 length;
  JOCTET b[APPN_DATA_LEN];
  unsigned int i, numtoread;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  /* get the interesting part of the marker data */
  if (length >= APPN_DATA_LEN)
    numtoread = APPN_DATA_LEN;
  else if (length > 0)
    numtoread = (unsigned int) length;
  else
    numtoread = 0;
  for (i = 0; i < numtoread; i++)
    INPUT_BYTE(cinfo, b[i], return FALSE);
  length -= numtoread;

  /* process it */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  case M_APP14:
    examine_app14(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  default:
    /* can't get here unless jpeg_save_markers chooses wrong processor */
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}